

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall cmCTestTestHandler::Initialize(cmCTestTestHandler *this)

{
  pointer piVar1;
  RegularExpression local_e0;
  
  cmCTestGenericHandler::Initialize(&this->super_cmCTestGenericHandler);
  (this->ElapsedTestingTime).__r = 0.0;
  std::
  vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
  ::clear(&this->TestResults);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CustomTestsIgnore);
  (this->StartTest)._M_string_length = 0;
  *(this->StartTest)._M_dataplus._M_p = '\0';
  (this->EndTest)._M_string_length = 0;
  *(this->EndTest)._M_dataplus._M_p = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CustomPreTest);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CustomPostTest);
  this->CustomMaximumPassedTestOutputSize = 0x400;
  this->CustomMaximumFailedTestOutputSize = 0x4b000;
  piVar1 = (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar1;
  }
  this->UseExcludeRegExpFirst = false;
  this->UseIncludeLabelRegExpFlag = false;
  this->UseExcludeLabelRegExpFlag = false;
  this->UseIncludeRegExpFlag = false;
  this->UseExcludeRegExpFlag = false;
  cmsys::RegularExpression::RegularExpression(&local_e0,"");
  cmsys::RegularExpression::operator=(&this->IncludeLabelRegularExpression,&local_e0);
  cmsys::RegularExpression::~RegularExpression(&local_e0);
  cmsys::RegularExpression::RegularExpression(&local_e0,"");
  cmsys::RegularExpression::operator=(&this->ExcludeLabelRegularExpression,&local_e0);
  cmsys::RegularExpression::~RegularExpression(&local_e0);
  (this->IncludeRegExp)._M_string_length = 0;
  *(this->IncludeRegExp)._M_dataplus._M_p = '\0';
  (this->ExcludeRegExp)._M_string_length = 0;
  *(this->ExcludeRegExp)._M_dataplus._M_p = '\0';
  (this->ExcludeFixtureRegExp)._M_string_length = 0;
  *(this->ExcludeFixtureRegExp)._M_dataplus._M_p = '\0';
  (this->ExcludeFixtureSetupRegExp)._M_string_length = 0;
  *(this->ExcludeFixtureSetupRegExp)._M_dataplus._M_p = '\0';
  (this->ExcludeFixtureCleanupRegExp)._M_string_length = 0;
  *(this->ExcludeFixtureCleanupRegExp)._M_dataplus._M_p = '\0';
  (this->TestsToRunString)._M_string_length = 0;
  *(this->TestsToRunString)._M_dataplus._M_p = '\0';
  this->UseUnion = false;
  std::
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ::clear(&this->TestList);
  return;
}

Assistant:

void cmCTestTestHandler::Initialize()
{
  this->Superclass::Initialize();

  this->ElapsedTestingTime = cmDuration();

  this->TestResults.clear();

  this->CustomTestsIgnore.clear();
  this->StartTest.clear();
  this->EndTest.clear();

  this->CustomPreTest.clear();
  this->CustomPostTest.clear();
  this->CustomMaximumPassedTestOutputSize = 1 * 1024;
  this->CustomMaximumFailedTestOutputSize = 300 * 1024;

  this->TestsToRun.clear();

  this->UseIncludeLabelRegExpFlag = false;
  this->UseExcludeLabelRegExpFlag = false;
  this->UseIncludeRegExpFlag = false;
  this->UseExcludeRegExpFlag = false;
  this->UseExcludeRegExpFirst = false;
  this->IncludeLabelRegularExpression = "";
  this->ExcludeLabelRegularExpression = "";
  this->IncludeRegExp.clear();
  this->ExcludeRegExp.clear();
  this->ExcludeFixtureRegExp.clear();
  this->ExcludeFixtureSetupRegExp.clear();
  this->ExcludeFixtureCleanupRegExp.clear();

  TestsToRunString.clear();
  this->UseUnion = false;
  this->TestList.clear();
}